

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall
kratos::SynthesizableVisitor::visit(SynthesizableVisitor *this,FunctionCallStmt *stmt)

{
  string *name;
  element_type *peVar1;
  pointer pcVar2;
  int iVar3;
  undefined1 local_60 [8];
  optional<kratos::BuiltinFunctionInfo> info;
  long local_38;
  FunctionCallStmt *local_28;
  FunctionCallStmt *stmt_local;
  
  local_28 = stmt;
  iVar3 = (*(((stmt->func_).
              super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xf])();
  if ((char)iVar3 == '\0') {
    iVar3 = (*(((stmt->func_).
                super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0x10])();
    if ((char)iVar3 == '\0') {
      return;
    }
    peVar1 = (stmt->func_).super___shared_ptr<kratos::FunctionStmtBlock,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar2 = (peVar1->function_name_)._M_dataplus._M_p;
    name = (string *)
           ((long)&info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
                   super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_payload + 0x10);
    info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
    super__Optional_payload_base<kratos::BuiltinFunctionInfo>._16_8_ = &stack0xffffffffffffffc8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)name,pcVar2,pcVar2 + (peVar1->function_name_)._M_string_length);
    get_builtin_function_info((optional<kratos::BuiltinFunctionInfo> *)local_60,name);
    if ((long *)info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
                super__Optional_payload_base<kratos::BuiltinFunctionInfo>._16_8_ !=
        &stack0xffffffffffffffc8) {
      operator_delete((void *)info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>.
                              _M_payload.super__Optional_payload_base<kratos::BuiltinFunctionInfo>.
                              _16_8_,local_38 + 1);
    }
    if (info.super__Optional_base<kratos::BuiltinFunctionInfo,_true,_true>._M_payload.
        super__Optional_payload_base<kratos::BuiltinFunctionInfo>._M_payload._M_value.max_num_args.
        _0_1_ != '\x01') {
      return;
    }
    if ((bool)local_60[4] != false) {
      return;
    }
  }
  std::vector<kratos::IRNode*,std::allocator<kratos::IRNode*>>::
  emplace_back<kratos::FunctionCallStmt*&>
            ((vector<kratos::IRNode*,std::allocator<kratos::IRNode*>> *)&this->nodes_,&local_28);
  return;
}

Assistant:

void visit(FunctionCallStmt* stmt) override {
        auto const& def = stmt->func();
        if (def->is_dpi()) {
            nodes_.emplace_back(stmt);
        } else if (def->is_builtin()) {
            auto info = get_builtin_function_info(def->function_name());
            if (info && !info->synthesizable) {
                nodes_.emplace_back(stmt);
            }
        }
    }